

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O2

void NULLC::HandleError(int signum,siginfo_t *info,void *ucontext)

{
  RegVmRegister *pRVar1;
  RegVmRegister *pRVar2;
  uchar *address;
  uchar *puVar3;
  CodeGenRegVmCallStackEntry *pCVar4;
  ExpiredCodeBlock *pEVar5;
  byte bVar6;
  char *error;
  uint i;
  uint index;
  ExecutorX86 *this;
  uint local_3c;
  
  this = currExecutor;
  if (signum == 0xb) {
    pRVar1 = (RegVmRegister *)(info->_sifields)._sigfault.si_addr;
    pRVar2 = (RegVmRegister *)(currExecutor->vmState).callStackEnd;
    if (pRVar1 <= pRVar2 + 0x400 && pRVar2 <= pRVar1) {
      error = "ERROR: call stack overflow";
      goto LAB_0013e521;
    }
    pRVar2 = (RegVmRegister *)(currExecutor->vmState).dataStackEnd;
    if (pRVar1 <= pRVar2 + 0x400 && pRVar2 <= pRVar1) {
      error = "ERROR: stack overflow";
      goto LAB_0013e521;
    }
    pRVar2 = (currExecutor->vmState).regFileArrayEnd;
    if (pRVar1 <= pRVar2 + 0x400 && pRVar2 <= pRVar1) {
      error = "ERROR: register overflow";
      goto LAB_0013e521;
    }
  }
  address = *(uchar **)((long)ucontext + 0xa8);
  index = 0;
  if ((address < currExecutor->binCode) ||
     (currExecutor->binCode + currExecutor->binCodeSize < address)) {
    local_3c = 0xffffffff;
    bVar6 = 0;
  }
  else {
    local_3c = GetInstructionFromAddress((uintptr_t)address);
    bVar6 = 1;
  }
  for (; index < (this->expiredCodeBlocks).count; index = index + 1) {
    pEVar5 = FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::operator[]
                       (&this->expiredCodeBlocks,index);
    if (pEVar5->code <= address) {
      pEVar5 = FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::operator[]
                         (&currExecutor->expiredCodeBlocks,index);
      puVar3 = pEVar5->code;
      pEVar5 = FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::operator[]
                         (&currExecutor->expiredCodeBlocks,index);
      this = currExecutor;
      if (address <= puVar3 + pEVar5->codeSize) goto LAB_0013e481;
    }
    this = currExecutor;
  }
  if ((bVar6 | (this->vmState).jitCodeActive) == 1) {
LAB_0013e481:
    if (signum == 8) {
      if (local_3c != 0xffffffff) {
        pCVar4 = (this->vmState).callStackTop;
        pCVar4->instruction = local_3c;
        (this->vmState).callStackTop = pCVar4 + 1;
      }
      error = "ERROR: integer division by zero";
    }
    else {
      if ((signum != 0xb) || ((void *)0xffff < (info->_sifields)._sigfault.si_addr))
      goto LAB_0013e49a;
      if (local_3c != 0xffffffff) {
        pCVar4 = (this->vmState).callStackTop;
        pCVar4->instruction = local_3c;
        (this->vmState).callStackTop = pCVar4 + 1;
      }
      error = "ERROR: null pointer access";
    }
LAB_0013e521:
    ExecutorX86::Stop(this,error);
    siglongjmp((__jmp_buf_tag *)errorHandler,1);
  }
LAB_0013e49a:
  signal(signum,(__sighandler_t)0x0);
  raise(signum);
  return;
}

Assistant:

void HandleError(int signum, siginfo_t *info, void *ucontext)
	{
		if(signum == SIGSEGV && uintptr_t(info->si_addr) >= uintptr_t(currExecutor->vmState.callStackEnd) && uintptr_t(info->si_addr) <= uintptr_t(currExecutor->vmState.callStackEnd) + 8192)
		{
			currExecutor->Stop("ERROR: call stack overflow");
			siglongjmp(errorHandler, 1);
		}

		if(signum == SIGSEGV && uintptr_t(info->si_addr) >= uintptr_t(currExecutor->vmState.dataStackEnd) && uintptr_t(info->si_addr) <= uintptr_t(currExecutor->vmState.dataStackEnd) + 8192)
		{
			currExecutor->Stop("ERROR: stack overflow");
			siglongjmp(errorHandler, 1);
		}

		if(signum == SIGSEGV && uintptr_t(info->si_addr) >= uintptr_t(currExecutor->vmState.regFileArrayEnd) && uintptr_t(info->si_addr) <= uintptr_t(currExecutor->vmState.regFileArrayEnd) + 8192)
		{
			currExecutor->Stop("ERROR: register overflow");
			siglongjmp(errorHandler, 1);
		}

#if defined(_M_X64)
		uintptr_t address = uintptr_t(((ucontext_t*)ucontext)->uc_mcontext.gregs[REG_RIP]);
#else
		uintptr_t address = uintptr_t(((ucontext_t*)ucontext)->uc_mcontext.gregs[REG_EIP]);
#endif

		// Check that exception happened in NULLC code
		bool isInternal = address >= uintptr_t(currExecutor->binCode) && address <= uintptr_t(currExecutor->binCode + currExecutor->binCodeSize);

		unsigned internalInstruction = isInternal ? GetInstructionFromAddress(address) : ~0u;

		for(unsigned i = 0; i < currExecutor->expiredCodeBlocks.size(); i++)
		{
			if(address >= uintptr_t(currExecutor->expiredCodeBlocks[i].code) && address <= uintptr_t(currExecutor->expiredCodeBlocks[i].code + currExecutor->expiredCodeBlocks[i].codeSize))
			{
				isInternal = true;
				break;
			}
		}

		if(currExecutor->vmState.jitCodeActive)
			isInternal = true;

		if(!isInternal)
		{
			signal(signum, SIG_DFL);
			raise(signum);
			return;
		}

		if(signum == SIGFPE)
		{
			AddCrashStackFrame(internalInstruction);

			currExecutor->Stop("ERROR: integer division by zero");

			siglongjmp(errorHandler, 1);
		}

		if(signum == SIGSEGV && uintptr_t(info->si_addr) < 0x00010000)
		{
			AddCrashStackFrame(internalInstruction);

			currExecutor->Stop("ERROR: null pointer access");

			siglongjmp(errorHandler, 1);
		}

		signal(signum, SIG_DFL);
		raise(signum);
	}